

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

int jx9Builtin_base64_decode(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  jx9_value *pObj;
  uint uVar1;
  char *pcVar2;
  ulong uVar3;
  int nLen_00;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  long lVar7;
  int nLen;
  char local_3e;
  byte local_3d;
  byte local_3c;
  int local_34;
  
  if (0 < nArg) {
    pcVar2 = jx9_value_to_string(*apArg,&local_34);
    lVar7 = (long)local_34;
    if (0 < lVar7) {
      do {
        if (pcVar2[lVar7 + -1] != '=') goto LAB_001357b1;
        lVar7 = lVar7 + -1;
      } while (lVar7 != 0);
      lVar7 = 0;
LAB_001357b1:
      uVar1 = 0;
      uVar6 = (uint)lVar7;
      if (3 < uVar6) {
        uVar4 = 0;
        do {
          local_3e = ((byte)(*(uint *)(SyBase64Decode_aBase64Trans +
                                      (ulong)((byte)pcVar2[uVar4 + 1] & 0x7f) * 4) >> 4) & 3) +
                     (char)*(undefined4 *)
                            (SyBase64Decode_aBase64Trans + (ulong)((byte)pcVar2[uVar4] & 0x7f) * 4)
                     * '\x04';
          local_3d = (byte)(*(uint *)(SyBase64Decode_aBase64Trans +
                                     (ulong)((byte)pcVar2[uVar4 + 2] & 0x7f) * 4) >> 2) & 0xf |
                     (byte)(*(uint *)(SyBase64Decode_aBase64Trans +
                                     (ulong)((byte)pcVar2[uVar4 + 1] & 0x7f) * 4) << 4);
          local_3c = (byte)*(undefined4 *)
                            (SyBase64Decode_aBase64Trans +
                            (ulong)((byte)pcVar2[uVar4 + 3] & 0x7f) * 4) & 0x3f |
                     (byte)(*(uint *)(SyBase64Decode_aBase64Trans +
                                     (ulong)((byte)pcVar2[uVar4 + 2] & 0x7f) * 4) << 6);
          jx9_value_string(pCtx->pRet,&local_3e,3);
          uVar1 = uVar4 + 4;
          uVar5 = uVar4 + 7;
          uVar4 = uVar1;
        } while (uVar5 < uVar6);
      }
      uVar3 = (ulong)uVar1;
      if ((uint)(uVar3 | 2) < uVar6) {
        local_3e = ((byte)(*(uint *)(SyBase64Decode_aBase64Trans +
                                    (ulong)((byte)pcVar2[uVar3 + 1] & 0x7f) * 4) >> 4) & 3) +
                   (char)*(undefined4 *)
                          (SyBase64Decode_aBase64Trans + (ulong)((byte)pcVar2[uVar3] & 0x7f) * 4) *
                   '\x04';
        local_3d = (byte)(*(uint *)(SyBase64Decode_aBase64Trans +
                                   (ulong)((byte)pcVar2[uVar3 | 2] & 0x7f) * 4) >> 2) & 0xf |
                   (byte)(*(uint *)(SyBase64Decode_aBase64Trans +
                                   (ulong)((byte)pcVar2[uVar3 + 1] & 0x7f) * 4) << 4);
        nLen_00 = 2;
      }
      else {
        if (uVar6 <= (uint)(uVar3 | 1)) {
          return 0;
        }
        local_3e = ((byte)(*(uint *)(SyBase64Decode_aBase64Trans +
                                    (ulong)((byte)pcVar2[uVar3 | 1] & 0x7f) * 4) >> 4) & 3) +
                   (char)*(undefined4 *)
                          (SyBase64Decode_aBase64Trans + (ulong)((byte)pcVar2[uVar3] & 0x7f) * 4) *
                   '\x04';
        nLen_00 = 1;
      }
      jx9_value_string(pCtx->pRet,&local_3e,nLen_00);
      return 0;
    }
  }
  pObj = pCtx->pRet;
  jx9MemObjRelease(pObj);
  (pObj->x).rVal = 0.0;
  pObj->iFlags = pObj->iFlags & 0xfffffe90U | 8;
  return 0;
}

Assistant:

static int jx9Builtin_base64_decode(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	const char *zIn;
	int nLen;
	if( nArg < 1 ){
		/* Missing arguments, return FALSE */
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Extract the input string */
	zIn = jx9_value_to_string(apArg[0], &nLen);
	if( nLen < 1 ){
		/* Nothing to process, return FALSE */
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Perform the BASE64 decoding */
	SyBase64Decode(zIn, (sxu32)nLen, Consumer, pCtx);
	return JX9_OK;
}